

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O1

int nvpair_append_string_array(nvpair_t *nvp,char *value)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  char *str;
  char *local_18;
  
  if (nvp == (nvpair_t *)0x0) {
    pcVar2 = "(nvp) != ((void*)0)";
  }
  else {
    if (nvp->nvp_magic == 0x6e7670) {
      if (nvp->nvp_type != 10) {
        __assert_fail("nvp->nvp_type == 10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x780,"int nvpair_append_string_array(nvpair_t *, const char *)");
      }
      if (value == (char *)0x0) {
        piVar4 = __errno_location();
        *piVar4 = 0x16;
      }
      else {
        pcVar2 = strdup(value);
        if (pcVar2 == (char *)0x0) {
          return -1;
        }
        local_18 = pcVar2;
        sVar3 = strlen(pcVar2);
        iVar1 = nvpair_append(nvp,&local_18,8,sVar3 + 1);
        if (iVar1 != -1) {
          return 0;
        }
        free(pcVar2);
      }
      return -1;
    }
    pcVar2 = "(nvp)->nvp_magic == 0x6e7670";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x77f,"int nvpair_append_string_array(nvpair_t *, const char *)");
}

Assistant:

int
nvpair_append_string_array(nvpair_t *nvp, const char *value)
{
	char *str;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);
	if (value == NULL) {
		ERRNO_SET(EINVAL);
		return (-1);
	}
	str = nv_strdup(value);
	if (str == NULL) {
		return (-1);
	}
	if (nvpair_append(nvp, &str, sizeof(str), strlen(str) + 1) == -1) {
		nv_free(str);
		return (-1);
	}
	return (0);
}